

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solitaire.cpp
# Opt level: O0

void __thiscall solitaire::Solitaire::tryAddCardsOnTableauPile(Solitaire *this,PileId *id)

{
  bool bVar1;
  uint *puVar2;
  reference pile;
  PileId local_1c;
  PileId *local_18;
  PileId *id_local;
  Solitaire *this_local;
  
  local_18 = id;
  id_local = (PileId *)this;
  piles::PileId::PileId(&local_1c,id);
  throwExceptionOnInvalidTableauPileId(this,&local_1c);
  bVar1 = isGameInProgressAndHandContainsCards(this);
  if (bVar1) {
    puVar2 = piles::PileId::operator_cast_to_unsigned_int_(id);
    pile = std::array<std::shared_ptr<solitaire::piles::interfaces::TableauPile>,_7UL>::operator[]
                     (&this->tableauPiles,(ulong)*puVar2);
    tryAddCardOnTableauPileFromHand(this,pile);
  }
  return;
}

Assistant:

void Solitaire::tryAddCardsOnTableauPile(const PileId id) {
    throwExceptionOnInvalidTableauPileId(id);
    if (isGameInProgressAndHandContainsCards())
        tryAddCardOnTableauPileFromHand(tableauPiles[id]);
}